

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarCommon.cpp
# Opt level: O2

int ZXing::OneD::DataBar::combins(int n,int r)

{
  int iVar1;
  uint uVar2;
  int iVar4;
  int iVar5;
  ulong uVar3;
  
  iVar4 = n - r;
  iVar1 = r;
  if (r < iVar4) {
    iVar1 = iVar4;
  }
  if (r <= iVar4) {
    iVar4 = r;
  }
  uVar3 = 1;
  iVar5 = 1;
  for (; iVar1 < n; n = n + -1) {
    uVar2 = (int)uVar3 * n;
    uVar3 = (ulong)uVar2;
    if (iVar5 <= iVar4) {
      uVar3 = (long)(int)uVar2 / (long)iVar5 & 0xffffffff;
      iVar5 = iVar5 + 1;
    }
  }
  while( true ) {
    if (iVar4 < iVar5) break;
    uVar3 = (long)(int)uVar3 / (long)iVar5 & 0xffffffff;
    iVar5 = iVar5 + 1;
  }
  return (int)uVar3;
}

Assistant:

static int combins(int n, int r)
{
	int maxDenom;
	int minDenom;
	if (n - r > r) {
		minDenom = r;
		maxDenom = n - r;
	} else {
		minDenom = n - r;
		maxDenom = r;
	}
	int val = 1;
	int j   = 1;
	for (int i = n; i > maxDenom; i--) {
		val *= i;
		if (j <= minDenom) {
			val /= j;
			j++;
		}
	}
	while (j <= minDenom) {
		val /= j;
		j++;
	}
	return val;
}